

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char_type *
fmt::v5::internal::
parse_format_specs<int,fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
          (basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx)

{
  char *pcVar1;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  handler;
  error_handler local_79;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  local_78;
  dynamic_format_specs<char> local_58;
  
  local_78.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  .super_specs_setter<char>.specs_ = &local_58.super_basic_format_specs<char>;
  local_58.super_basic_format_specs<char>.super_align_spec.width_ = 0;
  local_58.width_ref.field_1.name.size = 0;
  local_58.precision_ref.field_1.name.size = 0;
  local_58.super_basic_format_specs<char>.super_align_spec.fill_ = L' ';
  local_58.super_basic_format_specs<char>.super_align_spec.align_ = ALIGN_DEFAULT;
  local_58.super_basic_format_specs<char>.super_core_format_specs.precision = -1;
  local_58.super_basic_format_specs<char>.super_core_format_specs.flags = '\0';
  local_58.super_basic_format_specs<char>.super_core_format_specs.type = '\0';
  local_58.super_basic_format_specs<char>.super_core_format_specs._6_2_ = 0;
  local_58._20_4_ = 0;
  local_58.width_ref.kind = NONE;
  local_58.width_ref._4_4_ = 0;
  local_58.width_ref.field_1.name.value = (char *)0x0;
  local_58.precision_ref.kind = NONE;
  local_58.precision_ref._4_4_ = 0;
  local_58.precision_ref.field_1.name.value = (char *)0x0;
  local_78.arg_type_ = int_type;
  pcVar1 = (ctx->format_str_).data_;
  local_78.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  .specs_ = (dynamic_format_specs<char> *)
            local_78.
            super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
            .super_specs_setter<char>.specs_;
  local_78.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  .context_ = ctx;
  pcVar1 = parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                     (pcVar1,pcVar1 + (ctx->format_str_).size_,&local_78);
  if (((0x36 < (byte)local_58.super_basic_format_specs<char>.super_core_format_specs.type - 0x42) ||
      ((0x40300500400001U >>
        ((ulong)((byte)local_58.super_basic_format_specs<char>.super_core_format_specs.type - 0x42)
        & 0x3f) & 1) == 0)) &&
     (local_58.super_basic_format_specs<char>.super_core_format_specs.type != 0)) {
    error_handler::on_error(&local_79,"invalid type specifier");
  }
  return pcVar1;
}

Assistant:

FMT_CONSTEXPR wchar_t fill() const { return fill_; }